

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_OneHundredLeaks_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_OneHundredLeaks_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_OneHundredLeaks_Test *this_00;
  TEST_MemoryLeakDetectorTest_OneHundredLeaks_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_OneHundredLeaks_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0xb1);
  TEST_MemoryLeakDetectorTest_OneHundredLeaks_Test::TEST_MemoryLeakDetectorTest_OneHundredLeaks_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneHundredLeaks)
{
    const int amount_alloc = 100;
    char *mem[amount_alloc];
    for (int i = 0; i < amount_alloc; i++)
        mem[i] = detector->allocMemory(defaultMallocAllocator(), 3);
    detector->stopChecking();

    SimpleString output = detector->report(mem_leak_period_checking);

    STRCMP_CONTAINS("Memory leak(s) found", output.asCharString());
    STRCMP_CONTAINS("Total number of leaks", output.asCharString());
    STRCMP_CONTAINS("Memory leak reports about malloc and free", output.asCharString());

    //don't reuse i for vc6 compatibility
    for (int j = 0; j < amount_alloc; j++)
        PlatformSpecificFree(mem[j]);
}